

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLoad.c
# Opt level: O2

void Abc_SclAddWireLoad(SC_Man *p,Abc_Obj_t *pObj,int fSubtr)

{
  SC_Pair SVar1;
  SC_Pair SVar2;
  float fVar3;
  
  fVar3 = Abc_SclFindWireLoad(p->vWireCaps,(pObj->vFanouts).nSize);
  if (fSubtr != 0) {
    fVar3 = -fVar3;
  }
  SVar1 = p->pLoads[(uint)pObj->Id];
  SVar2.fall = fVar3 + SVar1.fall;
  SVar2.rise = fVar3 + SVar1.rise;
  p->pLoads[(uint)pObj->Id] = SVar2;
  return;
}

Assistant:

void Abc_SclAddWireLoad( SC_Man * p, Abc_Obj_t * pObj, int fSubtr )
{
    float Load = Abc_SclFindWireLoad( p->vWireCaps, Abc_ObjFanoutNum(pObj) );
    Abc_SclObjLoad(p, pObj)->rise += fSubtr ? -Load : Load;
    Abc_SclObjLoad(p, pObj)->fall += fSubtr ? -Load : Load;
}